

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
TypeTest_HeapTypeConstructors_Test::TestBody(TypeTest_HeapTypeConstructors_Test *this)

{
  allocator<wasm::Field> *this_00;
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  initializer_list<wasm::Field> __l_01;
  bool bVar1;
  char *pcVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference pvVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  char *in_R9;
  Entry EVar4;
  Array AVar5;
  Array AVar6;
  AssertHelper local_420;
  Message local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_5;
  Message local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_4;
  Message local_3d8;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_3;
  Type local_3b8;
  Field local_3b0;
  Array local_3a0;
  HeapType local_390;
  HeapType array2;
  Type local_378;
  Field local_370;
  iterator local_360;
  size_type local_358;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_350;
  Struct local_338;
  HeapType local_320;
  HeapType struct2;
  Type local_310;
  Signature local_308;
  HeapType local_2f8;
  HeapType sig2;
  Message local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_2;
  Message local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_1;
  Message local_2a8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_270;
  AssertHelper local_250;
  Message local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Field local_1f8;
  Array local_1e8;
  Entry local_1d8;
  uintptr_t local_1c8;
  uintptr_t local_1c0;
  Type structRef;
  allocator<wasm::Field> local_1a1;
  uintptr_t local_1a0;
  Field local_198;
  iterator local_188;
  size_type local_180;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_178;
  Struct local_160;
  Entry local_148;
  uintptr_t local_138;
  uintptr_t local_130;
  Type sigRef;
  Type local_118;
  Type local_110;
  Signature local_108;
  TypeBuilder local_f8;
  TypeBuilder builder;
  Type local_e8;
  Field local_e0;
  undefined1 local_d0 [16];
  HeapType local_c0;
  HeapType array;
  allocator<wasm::Field> local_a1;
  uintptr_t local_a0;
  Type local_98;
  Field local_90;
  Field *local_80;
  size_type local_78;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_70;
  Struct local_58;
  __uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> local_40;
  HeapType struct_;
  Type local_30;
  Signature local_28;
  HeapType local_18;
  HeapType sig;
  TypeTest_HeapTypeConstructors_Test *this_local;
  
  sig.id = (uintptr_t)this;
  ::wasm::Type::Type(&local_30,i32);
  ::wasm::Type::Type((Type *)&struct_,i32);
  ::wasm::Signature::Signature(&local_28,local_30,(Type)struct_.id);
  ::wasm::HeapType::HeapType(&local_18,local_28);
  local_a0 = local_18.id;
  ::wasm::Type::Type(&local_98,local_18,Nullable,Inexact);
  ::wasm::Field::Field(&local_90,local_98,Mutable);
  local_78 = 1;
  local_80 = &local_90;
  std::allocator<wasm::Field>::allocator(&local_a1);
  __l_01._M_len = local_78;
  __l_01._M_array = local_80;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_70,__l_01,&local_a1);
  ::wasm::Struct::Struct(&local_58,&local_70);
  ::wasm::HeapType::HeapType((HeapType *)&local_40,&local_58);
  ::wasm::Struct::~Struct(&local_58);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_70);
  std::allocator<wasm::Field>::~allocator(&local_a1);
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       local_40._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  ::wasm::Type::Type(&local_e8,
                     (HeapType)
                     local_40._M_t.
                     super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                     .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,Nullable,
                     Inexact);
  ::wasm::Field::Field(&local_e0,local_e8,Mutable);
  ::wasm::Array::Array((Array *)local_d0,local_e0);
  AVar5.element.packedType = (int)extraout_RDX;
  AVar5.element.mutable_ = (int)((ulong)extraout_RDX >> 0x20);
  AVar5.element.type.id = (uintptr_t)local_d0;
  ::wasm::HeapType::HeapType(&local_c0,AVar5);
  ::wasm::TypeBuilder::TypeBuilder(&local_f8,3);
  ::wasm::Type::Type(&local_110,i32);
  ::wasm::Type::Type(&local_118,i32);
  ::wasm::Signature::Signature(&local_108,local_110,local_118);
  EVar4 = ::wasm::TypeBuilder::operator[](&local_f8,0);
  sigRef.id = (uintptr_t)EVar4.builder;
  ::wasm::TypeBuilder::Entry::operator=((Entry *)&sigRef,local_108);
  local_148 = ::wasm::TypeBuilder::operator[](&local_f8,0);
  local_138 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_148);
  local_1a0 = ::wasm::TypeBuilder::getTempRefType((HeapType)&local_f8,(Nullability)local_138,Exact);
  local_130 = local_1a0;
  ::wasm::Field::Field(&local_198,(Type)local_1a0,Mutable);
  local_188 = &local_198;
  local_180 = 1;
  std::allocator<wasm::Field>::allocator(&local_1a1);
  __l_00._M_len = local_180;
  __l_00._M_array = local_188;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_178,__l_00,&local_1a1);
  ::wasm::Struct::Struct(&local_160,&local_178);
  EVar4 = ::wasm::TypeBuilder::operator[](&local_f8,1);
  structRef.id = (uintptr_t)EVar4.builder;
  ::wasm::TypeBuilder::Entry::operator=((Entry *)&structRef,&local_160);
  ::wasm::Struct::~Struct(&local_160);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_178);
  std::allocator<wasm::Field>::~allocator(&local_1a1);
  local_1d8 = ::wasm::TypeBuilder::operator[](&local_f8,1);
  local_1c8 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_1d8);
  local_1c0 = ::wasm::TypeBuilder::getTempRefType((HeapType)&local_f8,(Nullability)local_1c8,Exact);
  ::wasm::Field::Field(&local_1f8,(Type)local_1c0,Mutable);
  ::wasm::Array::Array(&local_1e8,local_1f8);
  EVar4 = ::wasm::TypeBuilder::operator[](&local_f8,2);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar4.builder;
  ::wasm::TypeBuilder::Entry::operator=
            ((Entry *)((long)&result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18),&local_1e8);
  ::wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_240,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_270,(internal *)local_240,(AssertionResult *)0x4945b1,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x266,pcVar2);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  if (bVar1) {
    __x = ::wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,__x);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,0);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_2a0,"built[0]","sig",pvVar3,&local_18);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
    if (!bVar1) {
      testing::Message::Message(&local_2a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x269,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_2a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,1);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_2c0,"built[1]","struct_",pvVar3,(HeapType *)&local_40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
    if (!bVar1) {
      testing::Message::Message(&local_2c8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x26a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_2c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,2);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_2e0,"built[2]","array",pvVar3,&local_c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
    if (!bVar1) {
      testing::Message::Message(&local_2e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&sig2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x26b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&sig2,&local_2e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sig2);
      testing::Message::~Message(&local_2e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
    ::wasm::Type::Type(&local_310,i32);
    ::wasm::Type::Type((Type *)&struct2,i32);
    ::wasm::Signature::Signature(&local_308,local_310,(Type)struct2.id);
    ::wasm::HeapType::HeapType(&local_2f8,local_308);
    ::wasm::Type::Type(&local_378,local_18,Nullable,Inexact);
    ::wasm::Field::Field(&local_370,local_378,Mutable);
    local_360 = &local_370;
    local_358 = 1;
    this_00 = (allocator<wasm::Field> *)((long)&array2.id + 7);
    std::allocator<wasm::Field>::allocator(this_00);
    __l._M_len = local_358;
    __l._M_array = local_360;
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_350,__l,this_00);
    ::wasm::Struct::Struct(&local_338,&local_350);
    ::wasm::HeapType::HeapType(&local_320,&local_338);
    ::wasm::Struct::~Struct(&local_338);
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_350);
    std::allocator<wasm::Field>::~allocator((allocator<wasm::Field> *)((long)&array2.id + 7));
    gtest_ar_3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )local_40._M_t.
             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    ::wasm::Type::Type(&local_3b8,
                       (HeapType)
                       local_40._M_t.
                       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                       Nullable,Inexact);
    ::wasm::Field::Field(&local_3b0,local_3b8,Mutable);
    ::wasm::Array::Array(&local_3a0,local_3b0);
    AVar6.element.packedType = (int)extraout_RDX_00;
    AVar6.element.mutable_ = (int)((ulong)extraout_RDX_00 >> 0x20);
    AVar6.element.type.id = (uintptr_t)&local_3a0;
    ::wasm::HeapType::HeapType(&local_390,AVar6);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_3d0,"sig","sig2",&local_18,&local_2f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
    if (!bVar1) {
      testing::Message::Message(&local_3d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x271,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_3d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_3d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_3f0,"struct_","struct2",(HeapType *)&local_40,&local_320);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
    if (!bVar1) {
      testing::Message::Message(&local_3f8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x272,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_3f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_3f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_410,"array","array2",&local_c0,&local_390);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
    if (!bVar1) {
      testing::Message::Message(&local_418);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
      testing::internal::AssertHelper::AssertHelper
                (&local_420,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x273,pcVar2);
      testing::internal::AssertHelper::operator=(&local_420,&local_418);
      testing::internal::AssertHelper::~AssertHelper(&local_420);
      testing::Message::~Message(&local_418);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_);
  }
  ::wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  ::wasm::TypeBuilder::~TypeBuilder(&local_f8);
  return;
}

Assistant:

TEST_F(TypeTest, HeapTypeConstructors) {
  HeapType sig(Signature(Type::i32, Type::i32));
  HeapType struct_(Struct({Field(Type(sig, Nullable), Mutable)}));
  HeapType array(Field(Type(struct_, Nullable), Mutable));

  TypeBuilder builder(3);
  builder[0] = Signature(Type::i32, Type::i32);
  Type sigRef = builder.getTempRefType(builder[0], Nullable);
  builder[1] = Struct({Field(sigRef, Mutable)});
  Type structRef = builder.getTempRefType(builder[1], Nullable);
  builder[2] = Array(Field(structRef, Mutable));

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  EXPECT_EQ(built[0], sig);
  EXPECT_EQ(built[1], struct_);
  EXPECT_EQ(built[2], array);

  HeapType sig2(Signature(Type::i32, Type::i32));
  HeapType struct2(Struct({Field(Type(sig, Nullable), Mutable)}));
  HeapType array2(Field(Type(struct_, Nullable), Mutable));

  EXPECT_EQ(sig, sig2);
  EXPECT_EQ(struct_, struct2);
  EXPECT_EQ(array, array2);
}